

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdAddConfidentialTxOutput
              (void *handle,void *create_handle,int64_t value_satoshi,char *address,
              char *direct_locking_script,char *asset_string,char *nonce)

{
  ConfidentialTransactionContext *this;
  bool bVar1;
  CfdException *pCVar2;
  allocator local_2a2;
  bool is_bitcoin;
  Script local_2a0;
  Amount amount;
  ConfidentialAssetId asset;
  ElementsAddressFactory address_factory;
  ConfidentialNonce nonce_obj;
  ElementsConfidentialAddress confidential_addr;
  
  cfd::Initialize();
  std::__cxx11::string::string
            ((string *)&confidential_addr,"TransactionData",(allocator *)&local_2a0);
  cfd::capi::CheckBuffer(create_handle,(string *)&confidential_addr);
  std::__cxx11::string::~string((string *)&confidential_addr);
  is_bitcoin = false;
  cfd::capi::ConvertNetType(*(int *)((long)create_handle + 0x10),&is_bitcoin);
  if (*(long *)((long)create_handle + 0x18) == 0) {
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&confidential_addr,"Invalid handle state. tx is null",
               (allocator *)&local_2a0);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)&confidential_addr)
    ;
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (is_bitcoin != true) {
    cfd::core::Amount::Amount(&amount,value_satoshi);
    this = *(ConfidentialTransactionContext **)((long)create_handle + 0x18);
    bVar1 = cfd::capi::IsEmptyString(asset_string);
    if (!bVar1) {
      std::__cxx11::string::string
                ((string *)&confidential_addr,asset_string,(allocator *)&local_2a0);
      cfd::core::ConfidentialAssetId::ConfidentialAssetId(&asset,(string *)&confidential_addr);
      std::__cxx11::string::~string((string *)&confidential_addr);
      cfd::core::ConfidentialNonce::ConfidentialNonce(&nonce_obj);
      bVar1 = cfd::capi::IsEmptyString(nonce);
      if (!bVar1) {
        std::__cxx11::string::string((string *)&local_2a0,nonce,(allocator *)&address_factory);
        cfd::core::ConfidentialNonce::ConfidentialNonce
                  ((ConfidentialNonce *)&confidential_addr,(string *)&local_2a0);
        cfd::core::ConfidentialNonce::operator=(&nonce_obj,(ConfidentialNonce *)&confidential_addr);
        cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)&confidential_addr);
        std::__cxx11::string::~string((string *)&local_2a0);
      }
      bVar1 = cfd::capi::IsEmptyString(address);
      if (bVar1) {
        bVar1 = cfd::capi::IsEmptyString(direct_locking_script);
        if (bVar1) {
          cfd::ConfidentialTransactionContext::UpdateFeeAmount(this,&amount,&asset);
        }
        else {
          std::__cxx11::string::string
                    ((string *)&local_2a0,direct_locking_script,(allocator *)&address_factory);
          cfd::core::Script::Script((Script *)&confidential_addr,(string *)&local_2a0);
          cfd::core::ConfidentialTransaction::AddTxOut
                    (&this->super_ConfidentialTransaction,&amount,&asset,
                     (Script *)&confidential_addr,&nonce_obj);
          cfd::core::Script::~Script((Script *)&confidential_addr);
          std::__cxx11::string::~string((string *)&local_2a0);
        }
      }
      else {
        cfd::ElementsAddressFactory::ElementsAddressFactory(&address_factory);
        std::__cxx11::string::string((string *)&confidential_addr,address,(allocator *)&local_2a0);
        bVar1 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress
                          ((string *)&confidential_addr);
        std::__cxx11::string::~string((string *)&confidential_addr);
        if (bVar1) {
          std::__cxx11::string::string((string *)&local_2a0,address,&local_2a2);
          cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                    (&confidential_addr,(string *)&local_2a0);
          std::__cxx11::string::~string((string *)&local_2a0);
          (*(this->super_ConfidentialTransaction).super_AbstractTransaction.
            _vptr_AbstractTransaction[0x13])(this,&confidential_addr,&amount,&asset,0);
          cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&confidential_addr);
        }
        else {
          std::__cxx11::string::string((string *)&local_2a0,address,&local_2a2);
          cfd::AddressFactory::GetAddress
                    (&confidential_addr.unblinded_address_,&address_factory.super_AddressFactory,
                     (string *)&local_2a0);
          std::__cxx11::string::~string((string *)&local_2a0);
          cfd::core::Address::GetLockingScript(&local_2a0,&confidential_addr.unblinded_address_);
          cfd::core::ConfidentialTransaction::AddTxOut
                    (&this->super_ConfidentialTransaction,&amount,&asset,&local_2a0,&nonce_obj);
          cfd::core::Script::~Script(&local_2a0);
          cfd::core::Address::~Address(&confidential_addr.unblinded_address_);
        }
        cfd::AddressFactory::~AddressFactory(&address_factory.super_AddressFactory);
      }
      cfd::core::ConfidentialNonce::~ConfidentialNonce(&nonce_obj);
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&asset);
      return 0;
    }
    confidential_addr.unblinded_address_._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x56;
    confidential_addr.unblinded_address_.witness_ver_ = 0xa90;
    confidential_addr.unblinded_address_.address_._M_dataplus._M_p = "CfdAddConfidentialTxOutput";
    cfd::core::logger::warn<>((CfdSourceLocation *)&confidential_addr,"asset is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&confidential_addr,"Failed to parameter. asset is null or empty.",
               (allocator *)&local_2a0);
    cfd::core::CfdException::CfdException
              (pCVar2,kCfdIllegalArgumentError,(string *)&confidential_addr);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&confidential_addr,"Invalid handle state. tx is bitcoin.",
             (allocator *)&local_2a0);
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)&confidential_addr);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddConfidentialTxOutput(
    void* handle, void* create_handle, int64_t value_satoshi,
    const char* address, const char* direct_locking_script,
    const char* asset_string, const char* nonce) {
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. tx is bitcoin.");
    }
    Amount amount = Amount(value_satoshi);

    ConfidentialTransactionContext* tx =
        static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
    if (IsEmptyString(asset_string)) {
      warn(CFD_LOG_SOURCE, "asset is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset is null or empty.");
    }
    ConfidentialAssetId asset = ConfidentialAssetId(asset_string);
    ConfidentialNonce nonce_obj;
    if (!IsEmptyString(nonce)) {
      nonce_obj = ConfidentialNonce(std::string(nonce));
    }

    if (!IsEmptyString(address)) {
      ElementsAddressFactory address_factory;
      if (ElementsConfidentialAddress::IsConfidentialAddress(address)) {
        ElementsConfidentialAddress confidential_addr(address);
        tx->AddTxOut(confidential_addr, amount, asset, false);
      } else {
        Address addr = address_factory.GetAddress(address);
        tx->AddTxOut(amount, asset, addr.GetLockingScript(), nonce_obj);
      }
    } else if (!IsEmptyString(direct_locking_script)) {
      tx->AddTxOut(amount, asset, Script(direct_locking_script), nonce_obj);
    } else {
      tx->UpdateFeeAmount(amount, asset);
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}